

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall stringToUnits_gasConstant_Test::TestBody(stringToUnits_gasConstant_Test *this)

{
  bool bVar1;
  uint64_t match_flags;
  char *message;
  char *in_R9;
  precise_unit pVar2;
  string local_b0;
  AssertHelper local_90;
  Message local_88;
  precise_unit local_80;
  unit_data local_70;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  allocator local_41;
  string local_40;
  undefined1 local_20 [8];
  precise_unit rval;
  stringToUnits_gasConstant_Test *this_local;
  
  rval._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"J mol^-1 K^-1",&local_41);
  match_flags = units::getDefaultFlags();
  pVar2 = units::unit_from_string(&local_40,match_flags);
  rval.multiplier_ = pVar2._8_8_;
  local_20 = (undefined1  [8])pVar2.multiplier_;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_80 = units::precise_measurement::as_unit((precise_measurement *)units::constants::R);
  local_70 = units::precise_unit::base_units(&local_80);
  local_69 = units::precise_unit::has_same_base((precise_unit *)local_20,local_70);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_68,
               (AssertionResult *)"rval.has_same_base(units::constants::R.as_unit().base_units())",
               "false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x287,message);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST(stringToUnits, gasConstant)
{
    auto rval = unit_from_string("J mol^-1 K^-1");

    EXPECT_TRUE(rval.has_same_base(units::constants::R.as_unit().base_units()));
}